

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall
crnlib::mipmapped_texture::read_from_file
          (mipmapped_texture *this,char *pFilename,format file_format)

{
  undefined1 uVar1;
  uint uVar2;
  char *in_RSI;
  mipmapped_texture *in_RDI;
  data_stream_serializer serializer;
  cfile_stream in_stream;
  bool success;
  undefined6 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 in_stack_ffffffffffffff6f;
  cfile_stream *this_00;
  format file_format_00;
  undefined7 in_stack_ffffffffffffff80;
  mipmapped_texture *in_stack_ffffffffffffff88;
  cfile_stream local_58;
  byte local_15;
  char *local_10;
  
  local_10 = in_RSI;
  clear(in_RDI);
  set_last_error(in_RDI,(char *)CONCAT17(in_stack_ffffffffffffff6f,
                                         CONCAT16(in_stack_ffffffffffffff6e,
                                                  in_stack_ffffffffffffff68)));
  local_15 = 0;
  this_00 = &local_58;
  cfile_stream::cfile_stream((cfile_stream *)in_RDI);
  uVar2 = cfile_stream::open(this_00,local_10,5,0);
  file_format_00 = (format)((ulong)this_00 >> 0x20);
  uVar1 = (undefined1)uVar2;
  if ((uVar2 & 1) != 0) {
    data_stream_serializer::data_stream_serializer
              ((data_stream_serializer *)&stack0xffffffffffffff88,&local_58.super_data_stream);
    local_15 = read_from_stream(in_stack_ffffffffffffff88,
                                (data_stream_serializer *)CONCAT17(uVar1,in_stack_ffffffffffffff80),
                                file_format_00);
  }
  cfile_stream::~cfile_stream((cfile_stream *)in_RDI);
  return (bool)(local_15 & 1);
}

Assistant:

bool mipmapped_texture::read_from_file(const char* pFilename, texture_file_types::format file_format) {
  clear();

  set_last_error("Can't open file");

  bool success = false;

  cfile_stream in_stream;
  if (in_stream.open(pFilename)) {
    data_stream_serializer serializer(in_stream);
    success = read_from_stream(serializer, file_format);
  }

  return success;
}